

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleQueue.hpp
# Opt level: O0

void __thiscall
gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::checkPullandSwap
          (SimpleQueue<helics::ActionMessage,_std::mutex> *this)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> pushLock;
  mutex_type *in_stack_ffffffffffffffb8;
  bool *this_00;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *in_stack_ffffffffffffffd0;
  
  bVar1 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                    (in_stack_ffffffffffffffd0);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffb8);
    bVar1 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                      (in_stack_ffffffffffffffd0);
    if (bVar1) {
      std::atomic<bool>::operator=
                ((atomic<bool> *)in_RDI,SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
    }
    else {
      std::swap<helics::ActionMessage,std::allocator<helics::ActionMessage>>
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)in_RDI,
                 (vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                 in_stack_ffffffffffffffb8);
      std::unique_lock<std::mutex>::unlock(in_RDI);
      this_00 = &in_RDI[6]._M_owns;
      __first = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::begin
                          ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                           this_00);
      __last = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::end
                         ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                          this_00);
      std::
      reverse<__gnu_cxx::__normal_iterator<helics::ActionMessage*,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>>>
                ((__normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                  )__first._M_current,
                 (__normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                  )__last._M_current);
    }
    std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  }
  return;
}

Assistant:

void checkPullandSwap()
        {
            if (pullElements.empty()) {
                std::unique_lock<MUTEX> pushLock(
                    m_pushLock);  // second pushLock
                if (!pushElements.empty()) {  // this is the potential for slow
                                              // operations
                    std::swap(pushElements, pullElements);
                    // we can free the push function to accept more elements
                    // after the swap call;
                    pushLock.unlock();
                    std::reverse(pullElements.begin(), pullElements.end());
                } else {
                    queueEmptyFlag = true;
                }
            }
        }